

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::addBlittingImageAllFormatsColorSrcFormatDstFormatTests
               (TestCaseGroup *group,BlitColorTestParams *testParams)

{
  TestContext *testCtx_00;
  BlittingTestCase *pBVar1;
  VkImageLayout layout;
  VkImageLayout layout_00;
  VkImageLayout layout_01;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  TestParams local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1d9;
  TestParams local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string description;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string testName;
  int dstLayoutNdx;
  int srcLayoutNdx;
  VkImageLayout blitDstLayouts [2];
  VkImageLayout blitSrcLayouts [2];
  TestContext *testCtx;
  BlitColorTestParams *testParams_local;
  TestCaseGroup *group_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&group->super_TestNode);
  blitDstLayouts[0] = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  blitDstLayouts[1] = VK_IMAGE_LAYOUT_GENERAL;
  _dstLayoutNdx = 0x100000007;
  uVar2 = extraout_RDX;
  for (testName.field_2._12_4_ = 0; (int)testName.field_2._12_4_ < 2;
      testName.field_2._12_4_ = testName.field_2._12_4_ + 1) {
    (testParams->params).src.image.operationLayout = blitDstLayouts[(int)testName.field_2._12_4_];
    for (testName.field_2._8_4_ = 0; (int)testName.field_2._8_4_ < 2;
        testName.field_2._8_4_ = testName.field_2._8_4_ + 1) {
      (testParams->params).dst.image.operationLayout = (&dstLayoutNdx)[(int)testName.field_2._8_4_];
      (testParams->params).field_3.filter = VK_FILTER_NEAREST;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_98,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 (VkImageLayout)uVar2);
      std::operator+(&local_78,&local_98,"_");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                ((string *)((long)&description.field_2 + 8),
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 layout);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&description.field_2 + 8));
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_148,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 layout_00);
      std::operator+(&local_128,"Blit from layout ",&local_148);
      std::operator+(&local_108,&local_128," to ");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_168,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 layout_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     &local_108,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      pBVar1 = (BlittingTestCase *)operator_new(0xc0);
      local_1d9 = 1;
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "_nearest");
      TestParams::TestParams(&local_1d8,&testParams->params);
      BlittingTestCase::BlittingTestCase(pBVar1,testCtx_00,&local_188,(string *)local_e8,&local_1d8)
      ;
      local_1d9 = 0;
      tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar1);
      TestParams::~TestParams(&local_1d8);
      std::__cxx11::string::~string((string *)&local_188);
      if ((testParams->onlyNearest & 1U) == 0) {
        (testParams->params).field_3.filter = VK_FILTER_LINEAR;
        pBVar1 = (BlittingTestCase *)operator_new(0xc0);
        std::operator+(&local_200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"_linear");
        TestParams::TestParams(&local_250,&testParams->params);
        BlittingTestCase::BlittingTestCase
                  (pBVar1,testCtx_00,&local_200,(string *)local_e8,&local_250);
        tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar1);
        TestParams::~TestParams(&local_250);
        std::__cxx11::string::~string((string *)&local_200);
      }
      std::__cxx11::string::~string((string *)local_e8);
      std::__cxx11::string::~string((string *)local_58);
      uVar2 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void addBlittingImageAllFormatsColorSrcFormatDstFormatTests (tcu::TestCaseGroup* group, BlitColorTestParams testParams)
{
	tcu::TestContext& testCtx				= group->getTestContext();

	const VkImageLayout blitSrcLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout blitDstLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(blitSrcLayouts); ++srcLayoutNdx)
	{
		testParams.params.src.image.operationLayout = blitSrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(blitDstLayouts); ++dstLayoutNdx)
		{
			testParams.params.dst.image.operationLayout = blitDstLayouts[dstLayoutNdx];

			testParams.params.filter			= VK_FILTER_NEAREST;
			const std::string testName			= getImageLayoutCaseName(testParams.params.src.image.operationLayout) + "_" +
												  getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			const std::string description		= "Blit from layout " + getImageLayoutCaseName(testParams.params.src.image.operationLayout) +
												  " to " + getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			group->addChild(new BlittingTestCase(testCtx, testName + "_nearest", description, testParams.params));

			if (!testParams.onlyNearest)
			{
				testParams.params.filter		= VK_FILTER_LINEAR;
				group->addChild(new BlittingTestCase(testCtx, testName + "_linear", description, testParams.params));
			}
		}
	}
}